

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O0

longdouble * __thiscall TPZStack<long_double,_10>::Pop(TPZStack<long_double,_10> *this)

{
  ostream *this_00;
  longdouble *plVar1;
  long in_RDI;
  longdouble temp;
  
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
  if (*(long *)(in_RDI + 0x10) < 0) {
    *(undefined8 *)(in_RDI + 0x10) = 0;
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZStack popping beyond the stack object");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    plVar1 = (longdouble *)std::ostream::flush();
  }
  else {
    plVar1 = *(longdouble **)(in_RDI + 8);
  }
  return plVar1;
}

Assistant:

T TPZStack<T, NumExtAlloc>::Pop() {
	this->fNElements--;
	if(this->fNElements <0){
		this->fNElements = 0;
		PZError << "TPZStack popping beyond the stack object" << std::endl;
		PZError.flush();
		T temp(0);
		return temp;
	}
	return this->fStore[this->fNElements];
}